

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O0

int __thiscall Pyraminx::count_correct_interior(Pyraminx *this)

{
  Color CVar1;
  size_type sVar2;
  __shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  int local_48;
  int j;
  Color center_color;
  int i;
  int interior_len;
  int interior_loc [6];
  int local_14;
  int count;
  Pyraminx *this_local;
  
  local_14 = 0;
  _i = 0x500000002;
  interior_loc[0] = 7;
  interior_loc[1] = 10;
  interior_loc[2] = 0xc;
  interior_loc[3] = 0xe;
  j = 0;
  while( true ) {
    sVar2 = std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::size
                      (&this->face_list);
    if (sVar2 <= (ulong)(long)j) break;
    p_Var3 = (__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::operator[]
                       (&this->face_list,(long)j);
    peVar4 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var3);
    CVar1 = Face::get_center_color(peVar4);
    for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
      p_Var3 = (__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::
               operator[](&this->face_list,(long)j);
      peVar4 = std::__shared_ptr_access<Face,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var3);
      if (peVar4->color_data[(&i)[local_48]] == CVar1) {
        local_14 = local_14 + 1;
      }
    }
    j = j + 1;
  }
  return local_14;
}

Assistant:

int Pyraminx::count_correct_interior(){
    int count = 0;
    int interior_loc[6] = {2, 5, 7, 10, 12, 14};
    int interior_len = sizeof(interior_loc)/ sizeof(int);
    for(int i = 0; i < face_list.size(); i++){
        Color center_color = face_list[i]->get_center_color();
        for(int j = 0; j< interior_len; j++){
            if(face_list[i]->color_data[interior_loc[j]] == center_color){
                count++;
            }
        }
    }
    //printf("Correct interior pieces: %i/24\n", count);
    return count; 
}